

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O0

void __thiscall
BooleanInstance::BooleanInstance
          (BooleanInstance *this,string *message_name,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bVar4;
  size_type sVar5;
  const_reference pvVar6;
  undefined8 *puVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string *in_stack_00000008;
  undefined4 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9c;
  undefined1 in_stack_ffffffffffffff9d;
  undefined1 in_stack_ffffffffffffff9e;
  undefined1 in_stack_ffffffffffffff9f;
  allocator *type;
  Instance *in_stack_ffffffffffffffb0;
  allocator local_39;
  string local_38 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_18;
  
  type = &local_39;
  local_18 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"Boolean",type);
  Instance::Instance(in_stack_ffffffffffffffb0,(string *)type);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  *(undefined ***)in_RDI = &PTR__BooleanInstance_0020ed30;
  uVar1 = std::operator==(in_RDI,(char *)CONCAT17(in_stack_ffffffffffffff9f,
                                                  CONCAT16(in_stack_ffffffffffffff9e,
                                                           CONCAT15(in_stack_ffffffffffffff9d,
                                                                    CONCAT14(
                                                  in_stack_ffffffffffffff9c,
                                                  in_stack_ffffffffffffff98)))));
  if ((!(bool)uVar1) &&
     (in_stack_ffffffffffffff9e =
           std::operator==(in_RDI,(char *)CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffff9e,
                                                                  CONCAT15(in_stack_ffffffffffffff9d
                                                                           ,CONCAT14(
                                                  in_stack_ffffffffffffff9c,
                                                  in_stack_ffffffffffffff98))))),
     !(bool)in_stack_ffffffffffffff9e)) {
    puVar7 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar7 = "RuntimeError: invalid message.";
    __cxa_throw(puVar7,&char_const*::typeinfo,0);
  }
  sVar5 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(local_18);
  if (sVar5 != 2) {
    puVar7 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar7 = "RuntimeError: wrong number of arguments.";
    __cxa_throw(puVar7,&char_const*::typeinfo,0);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](local_18,0);
  uVar2 = Grammar::is_variable(in_stack_00000008);
  if ((bool)uVar2) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](local_18,1);
    uVar3 = Grammar::is_boolean_value(in_RDI);
    if ((bool)uVar3) {
      pvVar6 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](local_18,0);
      std::__cxx11::string::operator=((string *)(in_RDI + 0x38),(string *)pvVar6);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](local_18,1);
      bVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)
              std::operator==(in_RDI,(char *)CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffff9e,
                                                                     CONCAT15(uVar2,CONCAT14(uVar3,
                                                  in_stack_ffffffffffffff98)))));
      in_RDI[0x58] = bVar4;
      return;
    }
  }
  puVar7 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar7 = "RuntimeError: invalid argument.";
  __cxa_throw(puVar7,&char_const*::typeinfo,0);
}

Assistant:

BooleanInstance::BooleanInstance(const std::string& message_name, const std::vector<std::string>& arguments) :
    Instance("Boolean") {
    if (message_name == "create:withValue:" || message_name == "createIfNotExists:withValue:") {
        if (arguments.size() != 2)
            throw EXC_WRONG_NUMBER_OF_ARGUMENTS;
        if (!Grammar::is_variable(arguments[0]) || !Grammar::is_boolean_value(arguments[1]))
            throw EXC_INVALID_ARGUMENT;
        _name = arguments[0];
        _value = (arguments[1] == "true");
    }
    else
        throw EXC_INVALID_MESSAGE;
}